

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t * Wlc_NtkCollectMemFanins(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs)

{
  int iVar1;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pObj_00;
  Vec_Int_t *vMemFanins;
  undefined4 local_28;
  int iFanin;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vMemObjs_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  for (iFanin = 0; iVar1 = Vec_IntSize(vMemObjs), iFanin < iVar1; iFanin = iFanin + 1) {
    iVar1 = Vec_IntEntry(vMemObjs,iFanin);
    pObj_00 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjType(pObj_00);
    if (iVar1 == 8) {
      iVar1 = Wlc_ObjFaninId0(pObj_00);
      Vec_IntPush(p_00,iVar1);
    }
    else {
      iVar1 = Wlc_ObjType(pObj_00);
      if ((iVar1 == 0x36) || (iVar1 = Wlc_ObjType(pObj_00), iVar1 == 0x37)) {
        for (local_28 = 0; iVar1 = Wlc_ObjFaninNum(pObj_00), local_28 < iVar1;
            local_28 = local_28 + 1) {
          iVar1 = Wlc_ObjFaninId(pObj_00,local_28);
          if (0 < local_28) {
            Vec_IntPush(p_00,iVar1);
          }
        }
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMemFanins( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs )
{
    Wlc_Obj_t * pObj; int i, k, iFanin;
    Vec_Int_t * vMemFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                    Vec_IntPush( vMemFanins, iFanin );
        }
    }
    return vMemFanins;
}